

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cornellbox.cpp
# Opt level: O0

void __thiscall CornellBox::CornellBox(CornellBox *this)

{
  ColorRGB c;
  ColorRGB local_15c;
  tmat4x4<float> local_150;
  tmat4x4<float> local_110;
  tmat4x4<float> local_d0;
  tmat4x4<float> local_90;
  tmat4x4<float> local_50;
  CornellBox *local_10;
  CornellBox *this_local;
  
  local_10 = this;
  glm::translate<float>(&local_d0,0.0,0.0,-40.0);
  glm::scale<float>(&local_110,20.0,20.0,20.0);
  glm::detail::operator*(&local_90,&local_d0,&local_110);
  glm::translate<float>(&local_150,-0.5,-0.5,0.5);
  glm::detail::operator*(&local_50,&local_90,&local_150);
  ColorRGB::ColorRGB(&local_15c);
  c.b = local_15c.b;
  c.r = local_15c.r;
  c.g = local_15c.g;
  SceneObject::SceneObject(&this->super_SceneObject,&local_50,c);
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR__CornellBox_00119cc8;
  std::vector<Triangle_*,_std::allocator<Triangle_*>_>::vector(&this->triangles);
  glm::detail::tvec3<float>::tvec3(&this->v6);
  glm::detail::tvec3<float>::tvec3(&this->v7);
  glm::detail::tvec3<float>::tvec3(&this->l2);
  glm::detail::tvec3<float>::tvec3(&this->l3);
  glm::detail::tvec3<float>::tvec3(&this->l0);
  glm::detail::tvec3<float>::tvec3(&this->l1);
  glm::detail::tvec3<float>::tvec3(&this->v2);
  glm::detail::tvec3<float>::tvec3(&this->v3);
  glm::detail::tvec3<float>::tvec3(&this->v4);
  glm::detail::tvec3<float>::tvec3(&this->v5);
  glm::detail::tvec3<float>::tvec3(&this->v0);
  glm::detail::tvec3<float>::tvec3(&this->v1);
  _calculateGeometry(this);
  return;
}

Assistant:

CornellBox::CornellBox() : 
    SceneObject(
        glm::translate<float>(0, 0, -40) *
        glm::scale<float>(20, 20, 20) *
        glm::translate<float>(-0.5, -0.5, 0.5),
        ColorRGB()) {
    _calculateGeometry();
}